

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tx_search.c
# Opt level: O1

void av1_pick_recursive_tx_size_type_yrd
               (AV1_COMP *cpi,MACROBLOCK *x,RD_STATS *rd_stats,BLOCK_SIZE bsize,int64_t ref_best_rd)

{
  MB_RD_INFO *pMVar1;
  BLOCK_SIZE bsize_00;
  char cVar2;
  TX_SIZE_SEARCH_METHOD TVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  MB_MODE_INFO *pMVar7;
  bool bVar8;
  double dVar9;
  undefined8 uVar10;
  int64_t iVar11;
  int64_t iVar12;
  macroblock_plane *pmVar13;
  TxfmSearchInfo *pTVar14;
  undefined7 uVar15;
  bool bVar16;
  int iVar17;
  int iVar18;
  uint32_t uVar19;
  int64_t iVar20;
  int iVar21;
  undefined7 in_register_00000009;
  long lVar22;
  uint uVar23;
  int iVar24;
  long lVar25;
  long lVar26;
  ulong uVar27;
  uint uVar28;
  MACROBLOCK *pMVar29;
  _func_int64_t_uint8_t_ptr_int_uint8_t_ptr_int_int_int **pp_Var30;
  byte bVar31;
  int iVar32;
  uint uVar33;
  int blk_col;
  ulong uVar34;
  long lVar35;
  long lVar36;
  MB_MODE_INFO *pMVar37;
  int iVar38;
  double dVar39;
  double dVar40;
  double sse_norm;
  MACROBLOCK *pMVar41;
  uint local_1f8;
  uint local_1f0;
  MB_RD_RECORD *local_1d8;
  double rate_f;
  long local_1c0;
  int64_t iStack_1b8;
  long local_1b0;
  byte local_1a8;
  int local_19c;
  int local_198;
  int local_194;
  int64_t *local_190;
  undefined8 local_188;
  ulong local_180;
  long local_178;
  ulong local_170;
  ulong local_168;
  long local_160;
  macroblockd_plane *local_158;
  ulong local_150;
  ulong local_148;
  int64_t dist;
  double dist_by_sse_norm_f;
  TXFM_CONTEXT tx_left [32];
  TXFM_CONTEXT tx_above [32];
  ENTROPY_CONTEXT ctxl [32];
  ENTROPY_CONTEXT ctxa [32];
  TXFM_CONTEXT tx_left_1 [32];
  TXFM_CONTEXT tx_above_1 [32];
  ENTROPY_CONTEXT ctxl_1 [32];
  
  local_188 = CONCAT71(in_register_00000009,bsize);
  rd_stats->rate = 0x7fffffff;
  rd_stats->zero_rate = 0;
  rd_stats->dist = 0x7fffffffffffffff;
  rd_stats->rdcost = 0x7fffffffffffffff;
  rd_stats->sse = 0x7fffffffffffffff;
  rd_stats->skip_txfm = '\0';
  lVar35 = (long)(cpi->sf).tx_sf.model_based_prune_tx_search_level;
  pMVar29 = x;
  if (ref_best_rd != 0x7fffffffffffffff && lVar35 != 0) {
    iVar18 = (x->e_mbd).plane[0].subsampling_x;
    iVar17 = (x->e_mbd).plane[0].subsampling_y;
    bsize_00 = av1_ss_size_lookup[bsize][iVar18][iVar17];
    iVar21 = (x->e_mbd).mb_to_bottom_edge;
    uVar33 = (uint)block_size_high[bsize_00];
    if (iVar21 < 0) {
      uVar23 = (iVar21 >> ((char)iVar17 + 3U & 0x1f)) + (uint)block_size_high[bsize_00];
      uVar33 = 0;
      if (0 < (int)uVar23) {
        uVar33 = uVar23;
      }
    }
    iVar17 = (x->e_mbd).mb_to_right_edge;
    uVar23 = (uint)block_size_wide[bsize_00];
    if (iVar17 < 0) {
      uVar28 = (iVar17 >> ((char)iVar18 + 3U & 0x1f)) + (uint)block_size_wide[bsize_00];
      uVar23 = 0;
      if (0 < (int)uVar28) {
        uVar23 = uVar28;
      }
    }
    iVar18 = (x->e_mbd).bd;
    if ((((x->e_mbd).cur_buf)->flags & 8) == 0) {
      pp_Var30 = &aom_sse;
    }
    else {
      pp_Var30 = &aom_highbd_sse;
    }
    cVar2 = (*(x->e_mbd).mi)->ref_frame[0];
    iVar20 = (**pp_Var30)(x->plane[0].src.buf,x->plane[0].src.stride,(x->e_mbd).plane[0].dst.buf,
                          (x->e_mbd).plane[0].dst.stride,uVar23,uVar33);
    bVar31 = (char)iVar18 * '\x02' - 0x10;
    lVar26 = (long)((ulong)((uint)(1 << (bVar31 & 0x1f)) >> 1) + iVar20) >> (bVar31 & 0x3f);
    bVar31 = 3;
    if ((((x->e_mbd).cur_buf)->flags & 8) != 0) {
      bVar31 = (char)(x->e_mbd).bd - 5;
    }
    pMVar29 = x;
    if (lVar26 == 0) {
      lVar36 = 0;
      lVar22 = 0;
    }
    else {
      iVar17 = (int)x->plane[0].dequant_QTX[1] >> (bVar31 & 0x1f);
      iVar18 = 1;
      if (1 < iVar17) {
        iVar18 = iVar17;
      }
      dVar40 = (double)(int)(uVar23 * uVar33);
      sse_norm = (double)lVar26 / dVar40;
      dVar9 = log2(sse_norm / ((double)iVar18 * (double)iVar18));
      av1_model_rd_curvfit(bsize_00,sse_norm,dVar9,&rate_f,&dist_by_sse_norm_f);
      dVar9 = (double)CONCAT44(rate_f._4_4_,rate_f._0_4_) * dVar40;
      dVar39 = 0.0;
      if (0.0 <= dVar9) {
        dVar39 = dVar9;
      }
      iVar18 = (int)(dVar39 + 0.5);
      if (iVar18 == 0) {
        lVar36 = 0;
        lVar22 = lVar26 << 4;
      }
      else {
        dVar40 = sse_norm * (double)CONCAT44(dist_by_sse_norm_f._4_4_,dist_by_sse_norm_f._0_4_) *
                 dVar40;
        dVar9 = 0.0;
        if (0.0 <= dVar40) {
          dVar9 = dVar40;
        }
        lVar36 = 0;
        lVar22 = lVar26 << 4;
        if ((long)(dVar9 + 0.5) * 0x80 + ((long)x->rdmult * (long)iVar18 + 0x100 >> 9) <
            lVar26 * 0x800) {
          lVar36 = (long)iVar18;
          lVar22 = (long)(dVar9 + 0.5);
        }
      }
      lVar22 = lVar22 << 7;
    }
    lVar25 = 0xffffffff;
    if (lVar26 < 0xffffffff) {
      lVar25 = lVar26;
    }
    x->pred_sse[cVar2] = (uint)lVar25;
    if ((lVar36 != 0) &&
       (ref_best_rd <
        (long)*(int *)((long)&DAT_0050f3c8 + lVar35 * 4 + 4) *
        ((lVar36 * x->rdmult + 0x100 >> 9) + lVar22) >> 3)) {
      return;
    }
  }
  iVar18 = (x->e_mbd).mi_row;
  uVar34 = 0;
  uVar27 = 0;
  if ((x->e_mbd).tile.mi_row_start <= iVar18) {
    if ((((int)(iVar18 + (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                               [bsize]) < (x->e_mbd).tile.mi_row_end) &&
        (iVar18 = (x->e_mbd).mi_col, (x->e_mbd).tile.mi_col_start <= iVar18)) &&
       ((int)(iVar18 + (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                             [bsize]) < (x->e_mbd).tile.mi_col_end)) {
      uVar27 = (ulong)((cpi->sf).rd_sf.use_mb_rd_hash != 0);
    }
    else {
      uVar27 = 0;
    }
  }
  iVar18 = 1 << ("\x04\x05\x05\x06\a\a\b\t\t\n\v\v\f\r\r\x0e\x06\x06\b\b\n\n"[bsize] - 4 & 0x1f);
  if ((char)uVar27 == '\0') {
    local_1d8 = (MB_RD_RECORD *)0x0;
  }
  else {
    pmVar13 = x->plane;
    pTVar14 = &x->txfm_search_info;
    x = pMVar29;
    uVar19 = (*av1_get_crc32c_value)
                       (&pTVar14->mb_rd_record->crc_calculator,(uint8_t *)pmVar13->src_diff,
                        (ulong)block_size_wide[bsize] * (ulong)block_size_high[bsize] * 2);
    uVar33 = uVar19 * 0x20 + (uint)bsize;
    uVar34 = (ulong)uVar33;
    local_1d8 = (x->txfm_search_info).mb_rd_record;
    iVar17 = -1;
    if ((ref_best_rd != 0x7fffffffffffffff) && (iVar21 = local_1d8->num, 0 < iVar21)) {
      iVar24 = local_1d8->index_start;
      do {
        iVar21 = iVar21 + -1;
        iVar17 = iVar24 % 8;
        if (local_1d8->mb_rd_info[iVar24 % 8].hash_value == uVar33) break;
        iVar24 = iVar24 + 1;
        iVar17 = -1;
      } while (iVar21 != 0);
    }
    pMVar29 = x;
    if (iVar17 != -1) {
      pMVar37 = *(x->e_mbd).mi;
      pMVar1 = local_1d8->mb_rd_info + iVar17;
      pMVar37->tx_size = pMVar1->tx_size;
      memcpy((x->txfm_search_info).blk_skip,pMVar1->blk_skip,(long)iVar18);
      uVar10 = *(undefined8 *)(pMVar1->inter_tx_size + 8);
      *(undefined8 *)pMVar37->inter_tx_size = *(undefined8 *)pMVar1->inter_tx_size;
      *(undefined8 *)(pMVar37->inter_tx_size + 8) = uVar10;
      memcpy((x->e_mbd).tx_type_map,local_1d8->mb_rd_info[iVar17].tx_type_map,(long)iVar18);
      iVar18 = local_1d8->mb_rd_info[iVar17].rd_stats.zero_rate;
      iVar20 = local_1d8->mb_rd_info[iVar17].rd_stats.dist;
      iVar11 = local_1d8->mb_rd_info[iVar17].rd_stats.rdcost;
      iVar12 = local_1d8->mb_rd_info[iVar17].rd_stats.sse;
      rd_stats->rate = local_1d8->mb_rd_info[iVar17].rd_stats.rate;
      rd_stats->zero_rate = iVar18;
      rd_stats->dist = iVar20;
      rd_stats->rdcost = iVar11;
      rd_stats->sse = iVar12;
      uVar15 = *(undefined7 *)&local_1d8->mb_rd_info[iVar17].rd_stats.field_0x21;
      rd_stats->skip_txfm = local_1d8->mb_rd_info[iVar17].rd_stats.skip_txfm;
      *(undefined7 *)&rd_stats->field_0x21 = uVar15;
      return;
    }
  }
  if (((x->txfm_search_params).skip_txfm_level == 0) ||
     (iVar17 = predict_skip_txfm(x,bsize,&dist,(uint)(cpi->common).features.reduced_tx_set_used),
     x = pMVar29, pMVar29 = x, iVar17 == 0)) {
    if (ref_best_rd == 0) {
      rd_stats->rate = 0x7fffffff;
      rd_stats->zero_rate = 0;
      rd_stats->dist = 0x7fffffffffffffff;
      rd_stats->rdcost = 0x7fffffffffffffff;
      rd_stats->sse = 0x7fffffffffffffff;
      rd_stats->skip_txfm = '\0';
    }
    else {
      TVar3 = (x->txfm_search_params).tx_size_search_method;
      local_160 = ref_best_rd;
      if (-ref_best_rd != -0x7fffffffffffffff && TVar3 != '\0') {
        lVar35 = 0;
        if (ref_best_rd >> 3 < -ref_best_rd + 0x7fffffffffffffff) {
          lVar35 = ref_best_rd >> 3;
        }
        local_160 = lVar35 + ref_best_rd;
      }
      local_158 = (x->e_mbd).plane;
      bVar31 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[bsize];
      bVar4 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[bsize];
      local_150 = uVar27;
      av1_get_entropy_contexts(bsize,local_158,ctxa,ctxl);
      memcpy(tx_above,(pMVar29->e_mbd).above_txfm_context,(ulong)bVar31);
      memcpy(tx_left,(pMVar29->e_mbd).left_txfm_context,(ulong)bVar4);
      local_168 = 2;
      if (((pMVar29->txfm_search_params).tx_size_search_method != '\x02') &&
         ((2 < (byte)((char)local_188 - 0xdU) || ((cpi->sf).tx_sf.tx_size_search_lgr_block == 0))))
      {
        local_168 = (ulong)(uint)(&((TX_SPEED_FEATURES *)(&(cpi->sf).intra_sf + 1))->
                                   inter_tx_size_search_init_depth_sqr)[bVar4 != bVar31];
      }
      local_170 = (ulong)""[bsize];
      uVar27 = (ulong)((uint)""[bsize] * 4);
      pMVar37 = (pMVar29->e_mbd).left_mbmi;
      pMVar7 = (pMVar29->e_mbd).above_mbmi;
      if (pMVar7 == (MB_MODE_INFO *)0x0) {
        uVar33 = 0;
      }
      else {
        uVar33 = (uint)pMVar7->skip_txfm;
      }
      uVar23 = *(uint *)((long)tx_size_high_unit + uVar27);
      local_180 = (ulong)uVar23;
      iVar17 = *(int *)((long)tx_size_wide_unit + uVar27);
      local_190 = &rd_stats->dist;
      iVar21 = 0;
      if (pMVar37 == (MB_MODE_INFO *)0x0) {
        uVar28 = 0;
      }
      else {
        uVar28 = (uint)pMVar37->skip_txfm;
      }
      local_194 = iVar17 * uVar23;
      local_178 = (long)(pMVar29->mode_costs).skip_txfm_cost[uVar28 + uVar33][0];
      lVar35 = (long)(pMVar29->mode_costs).skip_txfm_cost[uVar28 + uVar33][1];
      lVar36 = pMVar29->rdmult * lVar35 + 0x100 >> 9;
      lVar26 = pMVar29->rdmult * local_178 + 0x100 >> 9;
      rd_stats->rate = 0;
      *local_190 = 0;
      rd_stats->rdcost = 0;
      rd_stats->sse = 0;
      rd_stats->skip_txfm = '\x01';
      rd_stats->zero_rate = 0;
      bVar5 = block_size_high[bsize];
      iVar24 = 0;
      x = pMVar29;
      local_19c = iVar18;
      local_148 = uVar34;
      do {
        iVar32 = iVar24;
        iVar18 = (pMVar29->e_mbd).mb_to_bottom_edge;
        uVar33 = (uint)bVar5;
        if (iVar18 < 0) {
          uVar33 = (iVar18 >> ((char)(pMVar29->e_mbd).plane[0].subsampling_y + 3U & 0x1f)) +
                   (uint)bVar5;
        }
        local_198 = (int)uVar33 >> 2;
        if (local_198 <= iVar32) break;
        bVar6 = block_size_wide[bsize];
        iVar18 = 0;
        do {
          iVar38 = iVar18;
          iVar18 = (pMVar29->e_mbd).mb_to_right_edge;
          uVar33 = (uint)bVar6;
          if (iVar18 < 0) {
            uVar33 = (iVar18 >> ((char)(pMVar29->e_mbd).plane[0].subsampling_x + 3U & 0x1f)) +
                     (uint)bVar6;
          }
          if ((int)uVar33 >> 2 <= iVar38) break;
          lVar22 = lVar26;
          if (lVar36 < lVar26) {
            lVar22 = lVar36;
          }
          lVar22 = local_160 - lVar22;
          if (local_160 == 0x7fffffffffffffff) {
            lVar22 = 0x7fffffffffffffff;
          }
          dist_by_sse_norm_f._0_4_ = 1;
          select_tx_block(cpi,pMVar29,iVar32,iVar38,iVar21,(TX_SIZE)local_170,(int)local_168,bsize,
                          ctxa,ctxl,tx_above,tx_left,(RD_STATS *)&rate_f,0x7fffffffffffffff,lVar22,
                          (int *)&dist_by_sse_norm_f,TVar3 != '\0');
          pMVar29 = x;
          if (rate_f._0_4_ != 0x7fffffff && dist_by_sse_norm_f._0_4_ != 0) {
            if ((long)rd_stats->rate == 0x7fffffff) {
              rd_stats->rate = 0x7fffffff;
              rd_stats->zero_rate = 0;
              rd_stats->dist = 0x7fffffffffffffff;
              rd_stats->rdcost = 0x7fffffffffffffff;
              rd_stats->sse = 0x7fffffffffffffff;
              rd_stats->skip_txfm = '\0';
            }
            else {
              lVar26 = (long)rd_stats->rate + (long)rate_f._0_4_;
              if (0x7ffffffe < lVar26) {
                lVar26 = 0x7fffffff;
              }
              rd_stats->rate = (int)lVar26;
              if (rd_stats->zero_rate == 0) {
                rd_stats->zero_rate = rate_f._4_4_;
              }
              rd_stats->dist = rd_stats->dist + local_1c0;
              if ((rd_stats->sse != 0x7fffffffffffffff) && (local_1b0 != 0x7fffffffffffffff)) {
                rd_stats->sse = local_1b0 + rd_stats->sse;
              }
              rd_stats->skip_txfm = rd_stats->skip_txfm & local_1a8;
            }
            lVar36 = rd_stats->sse * 0x80 + (pMVar29->rdmult * lVar35 + 0x100 >> 9);
            lVar26 = rd_stats->dist * 0x80 +
                     ((rd_stats->rate + local_178) * (long)pMVar29->rdmult + 0x100 >> 9);
            iVar21 = iVar21 + local_194;
          }
          else {
            rd_stats->rate = 0x7fffffff;
            rd_stats->zero_rate = 0;
            rd_stats->dist = 0x7fffffffffffffff;
            rd_stats->rdcost = 0x7fffffffffffffff;
            rd_stats->sse = 0x7fffffffffffffff;
            rd_stats->skip_txfm = '\0';
          }
          iVar18 = iVar17 + iVar38;
          x = pMVar29;
        } while (rate_f._0_4_ != 0x7fffffff && dist_by_sse_norm_f._0_4_ != 0);
        iVar24 = (int)local_180 + iVar32;
      } while ((int)uVar33 >> 2 <= iVar38);
      lVar22 = 0x7fffffffffffffff;
      if ((local_198 <= iVar32) && (lVar22 = 0x7fffffffffffffff, rd_stats->rate != 0x7fffffff)) {
        rd_stats->skip_txfm = lVar36 <= lVar26;
        if ((TVar3 == '\0') || ((cpi->sf).tx_sf.refine_fast_tx_search_results == 0)) {
LAB_00239e36:
          if (rd_stats->skip_txfm == '\0') {
            lVar22 = rd_stats->dist * 0x80 +
                     ((rd_stats->rate + local_178) * (long)pMVar29->rdmult + 0x100 >> 9);
            if (((pMVar29->e_mbd).lossless[*(ushort *)&(*(pMVar29->e_mbd).mi)->field_0xa7 & 7] == 0)
               && (lVar35 = rd_stats->sse * 0x80 + (pMVar29->rdmult * lVar35 + 0x100 >> 9),
                  lVar35 <= lVar22)) {
              lVar22 = lVar35;
            }
          }
          else {
            lVar22 = rd_stats->sse * 0x80 + (pMVar29->rdmult * lVar35 + 0x100 >> 9);
          }
        }
        else {
          if (-1 < ref_best_rd) {
            rd_stats->rate = 0;
            *local_190 = 0;
            local_190[1] = 0;
            local_190[2] = 0;
            rd_stats->skip_txfm = '\x01';
            rd_stats->zero_rate = 0;
            iVar18 = (int)local_170;
            if ((pMVar29->e_mbd).lossless[*(ushort *)&(*(pMVar29->e_mbd).mi)->field_0xa7 & 7] != 0)
            {
              iVar18 = 0;
            }
            iVar17 = *(int *)((long)tx_size_high_unit + (ulong)(uint)(iVar18 << 2));
            iVar21 = *(int *)((long)tx_size_wide_unit + (ulong)(uint)(iVar18 << 2));
            iVar24 = 2;
            if (((pMVar29->txfm_search_params).tx_size_search_method != '\x02') &&
               ((2 < (byte)((char)local_188 - 0xdU) ||
                ((cpi->sf).tx_sf.tx_size_search_lgr_block == 0)))) {
              iVar24 = (&((TX_SPEED_FEATURES *)(&(cpi->sf).intra_sf + 1))->
                         inter_tx_size_search_init_depth_sqr)[bVar4 != bVar31];
            }
            pMVar29 = x;
            av1_get_entropy_contexts(bsize,local_158,(ENTROPY_CONTEXT *)&dist_by_sse_norm_f,ctxl_1);
            pMVar41 = pMVar29;
            memcpy(tx_above_1,(pMVar29->e_mbd).above_txfm_context,(ulong)bVar31);
            memcpy(tx_left_1,(pMVar29->e_mbd).left_txfm_context,(ulong)bVar4);
            bVar16 = true;
            lVar26 = 0;
            iVar38 = 0;
            iVar32 = 0;
            do {
              blk_col = 0;
              bVar8 = true;
              do {
                rate_f._0_4_ = 0;
                local_1c0 = 0;
                iStack_1b8 = 0;
                local_1b0 = 0;
                local_1a8 = 1;
                rate_f._4_4_ = 0;
                tx_block_yrd(cpi,pMVar29,iVar38,blk_col,iVar32,(TX_SIZE)iVar18,bsize,iVar24,
                             (ENTROPY_CONTEXT *)&dist_by_sse_norm_f,ctxl_1,tx_above_1,tx_left_1,
                             ref_best_rd - lVar26,(RD_STATS *)&rate_f,(FAST_TX_SEARCH_MODE)pMVar41);
                pMVar29 = pMVar41;
                lVar36 = (long)rate_f._0_4_;
                if (lVar36 == 0x7fffffff) {
                  rd_stats->rate = 0x7fffffff;
                  rd_stats->zero_rate = 0;
                  rd_stats->dist = 0x7fffffffffffffff;
                  rd_stats->rdcost = 0x7fffffffffffffff;
                  rd_stats->sse = 0x7fffffffffffffff;
                  rd_stats->skip_txfm = '\0';
                }
                else {
                  if ((long)rd_stats->rate == 0x7fffffff) {
                    rd_stats->rate = 0x7fffffff;
                    rd_stats->zero_rate = 0;
                    rd_stats->dist = 0x7fffffffffffffff;
                    rd_stats->rdcost = 0x7fffffffffffffff;
                    rd_stats->sse = 0x7fffffffffffffff;
                    rd_stats->skip_txfm = '\0';
                  }
                  else {
                    lVar22 = rd_stats->rate + lVar36;
                    if (0x7ffffffe < lVar22) {
                      lVar22 = 0x7fffffff;
                    }
                    rd_stats->rate = (int)lVar22;
                    if (rd_stats->zero_rate == 0) {
                      rd_stats->zero_rate = rate_f._4_4_;
                    }
                    rd_stats->dist = rd_stats->dist + local_1c0;
                    if ((rd_stats->sse != 0x7fffffffffffffff) && (local_1b0 != 0x7fffffffffffffff))
                    {
                      rd_stats->sse = local_1b0 + rd_stats->sse;
                    }
                    rd_stats->skip_txfm = rd_stats->skip_txfm & local_1a8;
                  }
                  lVar22 = local_1c0 * 0x80 + (pMVar29->rdmult * lVar36 + 0x100 >> 9);
                  lVar36 = local_1b0 * 0x80 +
                           ((long)rate_f._4_4_ * (long)pMVar29->rdmult + 0x100 >> 9);
                  if (lVar22 < lVar36) {
                    lVar36 = lVar22;
                  }
                  lVar26 = lVar26 + lVar36;
                  iVar32 = iVar32 + iVar21 * iVar17;
                }
                pMVar41 = pMVar29;
                if (rate_f._0_4_ == 0x7fffffff) break;
                blk_col = blk_col + iVar21;
                local_1f0 = (uint)bVar31;
                bVar8 = blk_col < (int)local_1f0;
              } while (blk_col < (int)local_1f0);
              if (bVar8) {
                if (bVar16) goto LAB_00239eec;
                break;
              }
              iVar38 = iVar38 + iVar17;
              local_1f8 = (uint)bVar4;
              bVar16 = iVar38 < (int)local_1f8;
            } while (iVar38 < (int)local_1f8);
            pMVar37 = (pMVar29->e_mbd).left_mbmi;
            pMVar7 = (pMVar29->e_mbd).above_mbmi;
            if (pMVar7 == (MB_MODE_INFO *)0x0) {
              uVar33 = 0;
            }
            else {
              uVar33 = (uint)pMVar7->skip_txfm;
            }
            if (pMVar37 == (MB_MODE_INFO *)0x0) {
              uVar23 = 0;
            }
            else {
              uVar23 = (uint)pMVar37->skip_txfm;
            }
            lVar36 = rd_stats->sse * 0x80 +
                     ((long)(pMVar29->mode_costs).skip_txfm_cost[uVar23 + uVar33][1] *
                      (long)pMVar29->rdmult + 0x100 >> 9);
            lVar26 = rd_stats->dist * 0x80 +
                     (((long)rd_stats->rate +
                      (long)(pMVar29->mode_costs).skip_txfm_cost[uVar23 + uVar33][0]) *
                      (long)pMVar29->rdmult + 0x100 >> 9);
            if (lVar36 < lVar26) {
              rd_stats->rate = 0;
              rd_stats->dist = rd_stats->sse;
              rd_stats->skip_txfm = '\x01';
              lVar26 = lVar36;
            }
            x = pMVar29;
            if (ref_best_rd < lVar26) goto LAB_00239e36;
          }
          rd_stats->rate = 0x7fffffff;
          rd_stats->zero_rate = 0;
          rd_stats->dist = 0x7fffffffffffffff;
          rd_stats->rdcost = 0x7fffffffffffffff;
          rd_stats->sse = 0x7fffffffffffffff;
          rd_stats->skip_txfm = '\0';
          pMVar29 = x;
LAB_00239eec:
          lVar22 = 0x7fffffffffffffff;
          x = pMVar29;
        }
      }
      if (lVar22 != 0x7fffffffffffffff) {
        if ((char)local_150 == '\0') {
          return;
        }
        iVar18 = local_1d8->index_start;
        iVar17 = local_1d8->num;
        if (iVar17 < 8) {
          uVar23 = iVar18 + iVar17;
          uVar33 = iVar18 + iVar17 + 7;
          if (-1 < (int)uVar23) {
            uVar33 = uVar23;
          }
          iVar18 = uVar23 - (uVar33 & 0xfffffff8);
          local_1d8->num = iVar17 + 1;
        }
        else {
          uVar33 = iVar18 + 8;
          if (-1 < (int)(iVar18 + 1U)) {
            uVar33 = iVar18 + 1U;
          }
          local_1d8->index_start = (iVar18 - (uVar33 & 0xfffffff8)) + 1;
        }
        lVar35 = (long)iVar18;
        pMVar37 = *(x->e_mbd).mi;
        pMVar1 = local_1d8->mb_rd_info + lVar35;
        pMVar1->hash_value = (uint32_t)local_148;
        pMVar1->tx_size = pMVar37->tx_size;
        iVar18 = local_19c;
        goto LAB_00239fb8;
      }
    }
    rd_stats->rate = 0x7fffffff;
    rd_stats->zero_rate = 0;
    rd_stats->dist = 0x7fffffffffffffff;
    rd_stats->rdcost = 0x7fffffffffffffff;
    rd_stats->sse = 0x7fffffffffffffff;
    rd_stats->skip_txfm = '\0';
  }
  else {
    set_skip_txfm(x,rd_stats,bsize,dist);
    if ((char)uVar27 == '\0') {
      return;
    }
    iVar17 = local_1d8->index_start;
    iVar21 = local_1d8->num;
    if (iVar21 < 8) {
      uVar23 = iVar17 + iVar21;
      uVar33 = iVar17 + iVar21 + 7;
      if (-1 < (int)uVar23) {
        uVar33 = uVar23;
      }
      iVar17 = uVar23 - (uVar33 & 0xfffffff8);
      local_1d8->num = iVar21 + 1;
    }
    else {
      uVar33 = iVar17 + 8;
      if (-1 < (int)(iVar17 + 1U)) {
        uVar33 = iVar17 + 1U;
      }
      local_1d8->index_start = (iVar17 - (uVar33 & 0xfffffff8)) + 1;
    }
    lVar35 = (long)iVar17;
    pMVar37 = *(x->e_mbd).mi;
    pMVar1 = local_1d8->mb_rd_info + lVar35;
    pMVar1->hash_value = (uint32_t)uVar34;
    pMVar1->tx_size = pMVar37->tx_size;
LAB_00239fb8:
    memcpy(pMVar1->blk_skip,(x->txfm_search_info).blk_skip,(long)iVar18);
    uVar10 = *(undefined8 *)(pMVar37->inter_tx_size + 8);
    *(undefined8 *)pMVar1->inter_tx_size = *(undefined8 *)pMVar37->inter_tx_size;
    *(undefined8 *)(pMVar1->inter_tx_size + 8) = uVar10;
    memcpy(local_1d8->mb_rd_info[lVar35].tx_type_map,(x->e_mbd).tx_type_map,(long)iVar18);
    iVar18 = rd_stats->zero_rate;
    iVar20 = rd_stats->dist;
    iVar11 = rd_stats->rdcost;
    iVar12 = rd_stats->sse;
    local_1d8->mb_rd_info[lVar35].rd_stats.rate = rd_stats->rate;
    local_1d8->mb_rd_info[lVar35].rd_stats.zero_rate = iVar18;
    local_1d8->mb_rd_info[lVar35].rd_stats.dist = iVar20;
    local_1d8->mb_rd_info[lVar35].rd_stats.rdcost = iVar11;
    local_1d8->mb_rd_info[lVar35].rd_stats.sse = iVar12;
    uVar15 = *(undefined7 *)&rd_stats->field_0x21;
    local_1d8->mb_rd_info[lVar35].rd_stats.skip_txfm = rd_stats->skip_txfm;
    *(undefined7 *)&local_1d8->mb_rd_info[lVar35].rd_stats.field_0x21 = uVar15;
  }
  return;
}

Assistant:

void av1_pick_recursive_tx_size_type_yrd(const AV1_COMP *cpi, MACROBLOCK *x,
                                         RD_STATS *rd_stats, BLOCK_SIZE bsize,
                                         int64_t ref_best_rd) {
  MACROBLOCKD *const xd = &x->e_mbd;
  const TxfmSearchParams *txfm_params = &x->txfm_search_params;
  assert(is_inter_block(xd->mi[0]));

  av1_invalid_rd_stats(rd_stats);

  // If modeled RD cost is a lot worse than the best so far, terminate early.
  if (cpi->sf.tx_sf.model_based_prune_tx_search_level &&
      ref_best_rd != INT64_MAX) {
    if (model_based_tx_search_prune(cpi, x, bsize, ref_best_rd)) return;
  }

  // Hashing based speed feature. If the hash of the prediction residue block is
  // found in the hash table, use previous search results and terminate early.
  uint32_t hash = 0;
  MB_RD_RECORD *mb_rd_record = NULL;
  const int mi_row = x->e_mbd.mi_row;
  const int mi_col = x->e_mbd.mi_col;
  const int within_border =
      mi_row >= xd->tile.mi_row_start &&
      (mi_row + mi_size_high[bsize] < xd->tile.mi_row_end) &&
      mi_col >= xd->tile.mi_col_start &&
      (mi_col + mi_size_wide[bsize] < xd->tile.mi_col_end);
  const int is_mb_rd_hash_enabled =
      (within_border && cpi->sf.rd_sf.use_mb_rd_hash);
  const int n4 = bsize_to_num_blk(bsize);
  if (is_mb_rd_hash_enabled) {
    hash = get_block_residue_hash(x, bsize);
    mb_rd_record = x->txfm_search_info.mb_rd_record;
    const int match_index = find_mb_rd_info(mb_rd_record, ref_best_rd, hash);
    if (match_index != -1) {
      MB_RD_INFO *mb_rd_info = &mb_rd_record->mb_rd_info[match_index];
      fetch_mb_rd_info(n4, mb_rd_info, rd_stats, x);
      return;
    }
  }

  // If we predict that skip is the optimal RD decision - set the respective
  // context and terminate early.
  int64_t dist;
  if (txfm_params->skip_txfm_level &&
      predict_skip_txfm(x, bsize, &dist,
                        cpi->common.features.reduced_tx_set_used)) {
    set_skip_txfm(x, rd_stats, bsize, dist);
    // Save the RD search results into mb_rd_record.
    if (is_mb_rd_hash_enabled)
      save_mb_rd_info(n4, hash, x, rd_stats, mb_rd_record);
    return;
  }
#if CONFIG_SPEED_STATS
  ++x->txfm_search_info.tx_search_count;
#endif  // CONFIG_SPEED_STATS

  const int64_t rd =
      select_tx_size_and_type(cpi, x, rd_stats, bsize, ref_best_rd);

  if (rd == INT64_MAX) {
    // We should always find at least one candidate unless ref_best_rd is less
    // than INT64_MAX (in which case, all the calls to select_tx_size_fix_type
    // might have failed to find something better)
    assert(ref_best_rd != INT64_MAX);
    av1_invalid_rd_stats(rd_stats);
    return;
  }

  // Save the RD search results into mb_rd_record.
  if (is_mb_rd_hash_enabled) {
    assert(mb_rd_record != NULL);
    save_mb_rd_info(n4, hash, x, rd_stats, mb_rd_record);
  }
}